

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instructions_list.c
# Opt level: O3

void vmread_(PDISASM pMyDisasm)

{
  char *pcVar1;
  UInt8 UVar2;
  undefined8 uVar3;
  bool bVar4;
  
  if ((pMyDisasm->Reserved_).EVEX.state == '\x01') {
    UVar2 = (pMyDisasm->Reserved_).VEX.pp;
    if (UVar2 == '\x03') {
      (pMyDisasm->Instruction).Category = 0x140000;
      (pMyDisasm->Reserved_).EVEX.tupletype = '\b';
      builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"vcvttsd2usi",0xc);
      bVar4 = (pMyDisasm->Reserved_).EVEX.W == '\x01';
      (pMyDisasm->Reserved_).MemDecoration = bVar4 + 0x67;
      (pMyDisasm->Reserved_).OperandSize = (uint)bVar4 * 0x20 + 0x20;
    }
    else {
      if (UVar2 != '\x02') {
        if (UVar2 == '\x01') {
          pcVar1 = (pMyDisasm->Instruction).Mnemonic;
          if ((pMyDisasm->Reserved_).EVEX.W != '\x01') {
            (pMyDisasm->Reserved_).EVEX.tupletype = '\x02';
            builtin_strncpy(pcVar1,"vcvttps2uqq",0xc);
            vex_GEx(pMyDisasm,0x68,0x6d,0x6e);
            return;
          }
          (pMyDisasm->Reserved_).EVEX.tupletype = '\x01';
          builtin_strncpy(pcVar1,"vcvttpd2uqq",0xc);
        }
        else {
          UVar2 = (pMyDisasm->Reserved_).EVEX.W;
          (pMyDisasm->Reserved_).EVEX.tupletype = '\x01';
          if (UVar2 == '\x01') {
            uVar3 = 0x3264707474766376;
          }
          else {
            uVar3 = 0x3273707474766376;
          }
          *(undefined8 *)(pMyDisasm->Instruction).Mnemonic = uVar3;
          (pMyDisasm->Instruction).Mnemonic[8] = 'u';
          (pMyDisasm->Instruction).Mnemonic[9] = 'd';
          (pMyDisasm->Instruction).Mnemonic[10] = 'q';
          (pMyDisasm->Instruction).Mnemonic[0xb] = '\0';
        }
        vex_GxEx(pMyDisasm);
        return;
      }
      (pMyDisasm->Instruction).Category = 0x140000;
      (pMyDisasm->Reserved_).EVEX.tupletype = '\a';
      builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"vcvttss2usi",0xc);
      (pMyDisasm->Reserved_).MemDecoration = 0x67;
      (pMyDisasm->Reserved_).OperandSize =
           (uint)((pMyDisasm->Reserved_).EVEX.W == '\x01') * 0x20 + 0x20;
    }
    decodeRegOpcode(&pMyDisasm->Operand1,pMyDisasm);
    (pMyDisasm->Reserved_).Register_ = 4;
    decodeModrm(&pMyDisasm->Operand2,pMyDisasm);
    (pMyDisasm->Reserved_).EIP_ =
         (pMyDisasm->Reserved_).EIP_ + (ulong)((pMyDisasm->Reserved_).DECALAGE_EIP + 2);
  }
  else if (((((pMyDisasm->Reserved_).VEX.state == '\x01') ||
            ((pMyDisasm->Prefix).OperandSize == '\x01')) || ((pMyDisasm->Reserved_).PrefRepe == 1))
          || ((pMyDisasm->Reserved_).PrefRepne == 1)) {
    builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"???",4);
    (pMyDisasm->Operand1).AccessMode = 0;
    (pMyDisasm->Operand2).AccessMode = 0;
    (pMyDisasm->Operand3).AccessMode = 0;
    (pMyDisasm->Operand4).AccessMode = 0;
    (pMyDisasm->Operand5).AccessMode = 0;
    (pMyDisasm->Operand6).AccessMode = 0;
    (pMyDisasm->Operand7).AccessMode = 0;
    (pMyDisasm->Operand8).AccessMode = 0;
    (pMyDisasm->Operand9).AccessMode = 0;
    (pMyDisasm->Reserved_).ERROR_OPCODE = -1;
  }
  else {
    (pMyDisasm->Instruction).Category = 0xb0000;
    builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"vmread",7);
    if ((pMyDisasm->Reserved_).Architecture == 0x40) {
      (pMyDisasm->Reserved_).OperandSize = 0x40;
    }
    EvGv(pMyDisasm);
    if ((pMyDisasm->Reserved_).Architecture == 0x40) {
      (pMyDisasm->Reserved_).OperandSize = 0x20;
    }
  }
  return;
}

Assistant:

void __bea_callspec__ vmread_(PDISASM pMyDisasm)
{
  if (GV.EVEX.state == InUsePrefix) {
    if (GV.VEX.pp == 1) {
      if (GV.EVEX.W == 1) {
        GV.EVEX.tupletype = FULL;
        #ifndef BEA_LIGHT_DISASSEMBLY
           (void) strcpy (pMyDisasm->Instruction.Mnemonic, "vcvttpd2uqq");
        #endif
        vex_GxEx(pMyDisasm);
      }
      else {
        GV.EVEX.tupletype = HALF;
        #ifndef BEA_LIGHT_DISASSEMBLY
           (void) strcpy (pMyDisasm->Instruction.Mnemonic, "vcvttps2uqq");
        #endif
        vex_GEx(pMyDisasm, Arg2qword, Arg2_m128_xmm, Arg2_m256_ymm);
      }
    }
    else if (GV.VEX.pp == 2) {
      pMyDisasm->Instruction.Category = AVX512_INSTRUCTION;
      GV.EVEX.tupletype = TUPLE1_FIXED__32;
      #ifndef BEA_LIGHT_DISASSEMBLY
         (void) strcpy (pMyDisasm->Instruction.Mnemonic, "vcvttss2usi");
      #endif
      GV.MemDecoration = Arg2dword;
      GV.OperandSize = (GV.EVEX.W == 1) ? 64 : 32;
      decodeRegOpcode(&pMyDisasm->Operand1, pMyDisasm);
      GV.Register_ = SSE_REG;
      decodeModrm(&pMyDisasm->Operand2, pMyDisasm);
      GV.EIP_ += GV.DECALAGE_EIP+2;
    }
    else if (GV.VEX.pp == 3) {
      pMyDisasm->Instruction.Category = AVX512_INSTRUCTION;
      GV.EVEX.tupletype = TUPLE1_FIXED__64;
      #ifndef BEA_LIGHT_DISASSEMBLY
         (void) strcpy (pMyDisasm->Instruction.Mnemonic, "vcvttsd2usi");
      #endif
      GV.MemDecoration = (GV.EVEX.W == 1) ? Arg2qword : Arg2dword;
      GV.OperandSize = (GV.EVEX.W == 1) ? 64 : 32;
      decodeRegOpcode(&pMyDisasm->Operand1, pMyDisasm);
      GV.Register_ = SSE_REG;
      decodeModrm(&pMyDisasm->Operand2, pMyDisasm);
      GV.EIP_ += GV.DECALAGE_EIP+2;
    }
    else {
      if (GV.EVEX.W == 1) {
        GV.EVEX.tupletype = FULL;
        #ifndef BEA_LIGHT_DISASSEMBLY
           (void) strcpy (pMyDisasm->Instruction.Mnemonic, "vcvttpd2udq");
        #endif
        vex_GxEx(pMyDisasm);
      }
      else {
        GV.EVEX.tupletype = FULL;
        #ifndef BEA_LIGHT_DISASSEMBLY
           (void) strcpy (pMyDisasm->Instruction.Mnemonic, "vcvttps2udq");
        #endif
        vex_GxEx(pMyDisasm);
      }
    }
  }
  else if (GV.VEX.state == InUsePrefix) {
    failDecode(pMyDisasm);
  }
  else {
    if (prefixes_present(pMyDisasm)) { failDecode(pMyDisasm); return; }
    pMyDisasm->Instruction.Category = VM_INSTRUCTION;
    #ifndef BEA_LIGHT_DISASSEMBLY
       (void) strcpy (pMyDisasm->Instruction.Mnemonic, "vmread");
    #endif
    if (GV.Architecture == 64) GV.OperandSize = 64;
    EvGv(pMyDisasm);
    if (GV.Architecture == 64) GV.OperandSize = 32;
  }
}